

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result * __thiscall
testing::internal::ReturnAction<ot::commissioner::Error>::
Impl<ot::commissioner::Error,_ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::Perform(Result *__return_storage_ptr__,
         Impl<ot::commissioner::Error,_ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
         *this,ArgumentTuple *param_1)

{
  ot::commissioner::Error::Error(__return_storage_ptr__,&this->value_);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple&) override { return value_; }